

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA5Application.cpp
# Opt level: O3

void PA5Application::resize(GLFWwindow *window,int framebufferWidth,int framebufferHeight)

{
  void *pvVar1;
  uint uVar2;
  float fVar3;
  
  pvVar1 = glfwGetWindowUserPointer(window);
  fVar3 = (float)framebufferWidth / (float)framebufferHeight + -1.1920929e-07;
  uVar2 = -(uint)(-fVar3 <= fVar3);
  if (0.0 < (float)(~uVar2 & (uint)-fVar3 | (uint)fVar3 & uVar2)) {
    *(float *)((long)pvVar1 + 0x20) =
         1.0 / (((float)framebufferWidth / (float)framebufferHeight) * 0.32004037);
    *(undefined8 *)((long)pvVar1 + 0x24) = 0;
    *(undefined8 *)((long)pvVar1 + 0x2c) = 0;
    *(undefined4 *)((long)pvVar1 + 0x34) = 0x4047f98a;
    *(undefined8 *)((long)pvVar1 + 0x38) = 0;
    *(undefined8 *)((long)pvVar1 + 0x40) = 0;
    *(undefined8 *)((long)pvVar1 + 0x48) = 0xbf800000bf80419a;
    *(undefined8 *)((long)pvVar1 + 0x50) = 0;
    *(undefined8 *)((long)pvVar1 + 0x58) = 0xbe4d0148;
    glViewport(0,0,framebufferWidth,framebufferHeight);
    return;
  }
  __assert_fail("abs(aspect - std::numeric_limits<T>::epsilon()) > static_cast<T>(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/ext/glm/glm/./gtc/matrix_transform.inl"
                ,0x159,"mat<4, 4, T, defaultp> glm::perspectiveRH_NO(T, T, T, T) [T = float]");
}

Assistant:

void PA5Application::resize(GLFWwindow * window, int framebufferWidth, int framebufferHeight)
{
  PA5Application & app = *static_cast<PA5Application *>(glfwGetWindowUserPointer(window));
  float aspect = framebufferWidth / float(framebufferHeight);
  app.m_proj = glm::perspective(120.f, aspect, 0.1f, 100.f);
  glViewport(0, 0, framebufferWidth, framebufferHeight);
}